

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_len_encode(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  uint uVar1;
  uint uVar2;
  int local_28;
  int r;
  int32_t i32;
  int in_size_local;
  char *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  local_28 = in_size;
  r = in_size;
  _i32 = in;
  in_local = (char *)c;
  c_local = (cram_codec *)slice;
  uVar1 = (*((c->field_6).e_byte_array_len.len_codec)->encode)
                    (slice,(c->field_6).e_byte_array_len.len_codec,(char *)&local_28,1);
  uVar2 = (**(code **)(*(long *)(in_local + 0x50) + 0x20))
                    (c_local,*(undefined8 *)(in_local + 0x50),_i32,r);
  return uVar2 | uVar1;
}

Assistant:

int cram_byte_array_len_encode(cram_slice *slice, cram_codec *c,
			       char *in, int in_size) {
    int32_t i32 = in_size;
    int r = 0;

    r |= c->e_byte_array_len.len_codec->encode(slice,
					       c->e_byte_array_len.len_codec,
					       (char *)&i32, 1);
    r |= c->e_byte_array_len.val_codec->encode(slice,
					       c->e_byte_array_len.val_codec,
					       in, in_size);
    return r;
}